

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O2

int AString_compareCString(AString *str,char *cstr)

{
  int iVar1;
  
  iVar1 = 1;
  if (str == (AString *)0x0) {
    iVar1 = (str == (AString *)0x0 && cstr == (char *)0x0) - 1;
  }
  if (str == (AString *)0x0 || cstr == (char *)0x0) {
    return iVar1;
  }
  iVar1 = strcmp(str->buffer,cstr);
  return iVar1;
}

Assistant:

ACUTILS_HD_FUNC int AString_compareCString(const struct AString *str, const char *cstr)
{
    if(str == nullptr && cstr == nullptr)
        return 0;
    else if(str == nullptr)
        return -1;
    else if(cstr == nullptr)
        return 1;
    return strcmp(str->buffer, cstr);
}